

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

ptr<rpc_listener> __thiscall
nuraft::asio_service::create_rpc_listener(asio_service *this,ushort listening_port,ptr<logger> *l)

{
  shared_ptr<nuraft::asio_rpc_listener> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  io_context *in_RSI;
  context *in_RDI;
  ptr<rpc_listener> pVar1;
  exception *ee;
  shared_ptr<nuraft::rpc_listener> *in_stack_ffffffffffffff70;
  bool *in_stack_ffffffffffffff78;
  asio_service_impl **in_stack_ffffffffffffff98;
  shared_ptr<nuraft::logger> *in_stack_ffffffffffffffb0;
  
  cs_new<nuraft::asio_rpc_listener,nuraft::asio_service_impl*&,asio::io_context&,asio::ssl::context&,unsigned_short&,bool&,std::shared_ptr<nuraft::logger>&>
            (in_stack_ffffffffffffff98,in_RSI,in_RDI,(unsigned_short *)in_RDI,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffffb0);
  std::shared_ptr<nuraft::rpc_listener>::shared_ptr<nuraft::asio_rpc_listener,void>
            (in_stack_ffffffffffffff70,in_RCX);
  std::shared_ptr<nuraft::asio_rpc_listener>::~shared_ptr
            ((shared_ptr<nuraft::asio_rpc_listener> *)0x3bca15);
  pVar1.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ptr<rpc_listener>)
         pVar1.super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<rpc_listener> asio_service::create_rpc_listener( ushort listening_port,
                                                     ptr<logger>& l )
{
    try {
        return cs_new< asio_rpc_listener >
                     ( impl_,
                       impl_->io_svc_,
                       impl_->ssl_server_ctx_,
                       listening_port,
                       impl_->my_opt_.enable_ssl_,
                       l );
    } catch (std::exception& ee) {
        // Most likely exception happens due to wrong endpoint.
        p_er("got exception: %s", ee.what());
        return nullptr;
    }
}